

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O2

void __thiscall libtorrent::aux::session_impl::on_dht_announce(session_impl *this,error_code *e)

{
  uint uVar1;
  pointer psVar2;
  pointer psVar3;
  element_type *peVar4;
  ulong uVar5;
  ulong uVar6;
  shared_ptr<libtorrent::aux::torrent> t;
  __shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2> local_68 [2];
  __shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2> local_40;
  
  if (e->failed_ == true) {
    if (((this->m_alerts).m_alert_mask._M_i.m_val >> 0xd & 1) != 0) {
      uVar1 = e->val_;
      (*e->cat_->_vptr_error_category[4])(local_68,e->cat_,(ulong)uVar1);
      session_log(this,"aborting DHT announce timer (%d): %s",(ulong)uVar1,local_68[0]._M_ptr);
      ::std::__cxx11::string::~string((string *)local_68);
    }
  }
  else {
    if (this->m_abort == true) {
      session_log(this,"aborting DHT announce timer: m_abort set");
      return;
    }
    if ((this->m_dht).super___shared_ptr<libtorrent::dht::dht_tracker,_(__gnu_cxx::_Lock_policy)2>.
        _M_ptr == (element_type *)0x0) {
      ::std::
      deque<std::weak_ptr<libtorrent::aux::torrent>,_std::allocator<std::weak_ptr<libtorrent::aux::torrent>_>_>
      ::clear(&this->m_dht_torrents);
      return;
    }
    update_dht_announce_interval(this);
    if ((this->m_dht_torrents).
        super__Deque_base<std::weak_ptr<libtorrent::aux::torrent>,_std::allocator<std::weak_ptr<libtorrent::aux::torrent>_>_>
        ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
        (this->m_dht_torrents).
        super__Deque_base<std::weak_ptr<libtorrent::aux::torrent>,_std::allocator<std::weak_ptr<libtorrent::aux::torrent>_>_>
        ._M_impl.super__Deque_impl_data._M_start._M_cur) {
      local_68[0]._M_ptr = (torrent *)0x0;
      local_68[0]._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      do {
        ::std::__shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
                  (&local_40);
        ::std::__shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>::operator=
                  (local_68,&local_40);
        ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40._M_refcount);
        ::std::
        deque<std::weak_ptr<libtorrent::aux::torrent>,_std::allocator<std::weak_ptr<libtorrent::aux::torrent>_>_>
        ::pop_front(&this->m_dht_torrents);
        peVar4 = local_68[0]._M_ptr;
        if (local_68[0]._M_ptr != (torrent *)0x0) {
          torrent::dht_announce(local_68[0]._M_ptr);
          break;
        }
      } while ((this->m_dht_torrents).
               super__Deque_base<std::weak_ptr<libtorrent::aux::torrent>,_std::allocator<std::weak_ptr<libtorrent::aux::torrent>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_cur !=
               (this->m_dht_torrents).
               super__Deque_base<std::weak_ptr<libtorrent::aux::torrent>,_std::allocator<std::weak_ptr<libtorrent::aux::torrent>_>_>
               ._M_impl.super__Deque_impl_data._M_start._M_cur);
      ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_68[0]._M_refcount);
      if (peVar4 != (torrent *)0x0) {
        return;
      }
    }
    psVar2 = (this->m_torrents).m_array.
             super__Vector_base<std::shared_ptr<libtorrent::aux::torrent>,_std::allocator<std::shared_ptr<libtorrent::aux::torrent>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    psVar3 = (this->m_torrents).m_array.
             super__Vector_base<std::shared_ptr<libtorrent::aux::torrent>,_std::allocator<std::shared_ptr<libtorrent::aux::torrent>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (psVar2 != psVar3) {
      uVar6 = this->m_next_dht_torrent;
      if ((ulong)((long)psVar3 - (long)psVar2 >> 4) <= uVar6) {
        this->m_next_dht_torrent = 0;
        uVar6 = 0;
      }
      torrent::dht_announce
                (psVar2[uVar6].
                 super___shared_ptr<libtorrent::aux::torrent,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      uVar5 = this->m_next_dht_torrent + 1;
      uVar6 = 0;
      if (uVar5 < (ulong)((long)(this->m_torrents).m_array.
                                super__Vector_base<std::shared_ptr<libtorrent::aux::torrent>,_std::allocator<std::shared_ptr<libtorrent::aux::torrent>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->m_torrents).m_array.
                                super__Vector_base<std::shared_ptr<libtorrent::aux::torrent>,_std::allocator<std::shared_ptr<libtorrent::aux::torrent>_>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 4)) {
        uVar6 = uVar5;
      }
      this->m_next_dht_torrent = uVar6;
    }
  }
  return;
}

Assistant:

void session_impl::on_dht_announce(error_code const& e)
	{
		COMPLETE_ASYNC("session_impl::on_dht_announce");
		TORRENT_ASSERT(is_single_thread());
		if (e)
		{
#ifndef TORRENT_DISABLE_LOGGING
			if (should_log())
			{
				session_log("aborting DHT announce timer (%d): %s"
					, e.value(), e.message().c_str());
			}
#endif
			return;
		}

		if (m_abort)
		{
#ifndef TORRENT_DISABLE_LOGGING
			session_log("aborting DHT announce timer: m_abort set");
#endif
			return;
		}

		if (!m_dht)
		{
			m_dht_torrents.clear();
			return;
		}

		TORRENT_ASSERT(m_dht);

		update_dht_announce_interval();

		if (!m_dht_torrents.empty())
		{
			std::shared_ptr<torrent> t;
			do
			{
				t = m_dht_torrents.front().lock();
				m_dht_torrents.pop_front();
			} while (!t && !m_dht_torrents.empty());

			if (t)
			{
				t->dht_announce();
				return;
			}
		}
		if (m_torrents.empty()) return;

		if (m_next_dht_torrent >= m_torrents.size())
			m_next_dht_torrent = 0;
		m_torrents[m_next_dht_torrent]->dht_announce();
		// TODO: 2 make a list for torrents that want to be announced on the DHT so we
		// don't have to loop over all torrents, just to find the ones that want to announce
		++m_next_dht_torrent;
		if (m_next_dht_torrent >= m_torrents.size())
			m_next_dht_torrent = 0;
	}